

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

Type __thiscall wasm::Literals::getType(Literals *this)

{
  long lVar1;
  Literals *__range2;
  array<wasm::Literal,_1UL> *paVar2;
  size_t sVar3;
  ConstIterator CVar4;
  Type local_58;
  size_t local_50;
  undefined1 auStack_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  
  lVar1 = ((long)(this->super_SmallVector<wasm::Literal,_1UL>).flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->super_SmallVector<wasm::Literal,_1UL>).flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18 +
          (this->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
  if (lVar1 == 0) {
    local_58.id = 0;
  }
  else if (lVar1 == 1) {
    local_58.id = (this->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id;
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    CVar4 = SmallVector<wasm::Literal,_1UL>::end(&this->super_SmallVector<wasm::Literal,_1UL>);
    local_50 = CVar4.
               super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
               .index;
    lVar1 = -0x18;
    for (sVar3 = 0;
        local_50 != sVar3 ||
        CVar4.
        super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
        .parent != &this->super_SmallVector<wasm::Literal,_1UL>; sVar3 = sVar3 + 1) {
      paVar2 = (array<wasm::Literal,_1UL> *)
               ((long)&((this->super_SmallVector<wasm::Literal,_1UL>).flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start)->field_0 + lVar1);
      if (sVar3 == 0) {
        paVar2 = &(this->super_SmallVector<wasm::Literal,_1UL>).fixed;
      }
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,
                 &paVar2->_M_elems[0].type);
      lVar1 = lVar1 + 0x18;
    }
    wasm::Type::Type(&local_58,(Tuple *)auStack_48);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48);
  }
  return (Type)local_58.id;
}

Assistant:

Type getType() const {
    if (empty()) {
      return Type::none;
    }
    if (size() == 1) {
      return (*this)[0].type;
    }
    std::vector<Type> types;
    for (auto& val : *this) {
      types.push_back(val.type);
    }
    return Type(types);
  }